

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  uint uVar1;
  type pTVar2;
  TablePrinter *pTVar3;
  element_type *peVar4;
  Duration local_30;
  BenchmarkInfo *local_18;
  BenchmarkInfo *info_local;
  ConsoleReporter *this_local;
  
  local_18 = info;
  info_local = (BenchmarkInfo *)this;
  pTVar2 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
           operator*(&this->m_tablePrinter);
  pTVar3 = Catch::operator<<(pTVar2,&local_18->samples);
  pTVar3 = Catch::operator<<(pTVar3);
  pTVar3 = Catch::operator<<(pTVar3,&local_18->iterations);
  Catch::operator<<(pTVar3);
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  uVar1 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x15])();
  if ((uVar1 & 1) == 0) {
    pTVar2 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
             ::operator*(&this->m_tablePrinter);
    anon_unknown_2::Duration::Duration(&local_30,local_18->estimatedDuration,Auto);
    pTVar3 = Catch::operator<<(pTVar2,&local_30);
    Catch::operator<<(pTVar3);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    (*m_tablePrinter) << info.samples << ColumnBreak()
        << info.iterations << ColumnBreak();
    if (!m_config->benchmarkNoAnalysis())
        (*m_tablePrinter) << Duration(info.estimatedDuration) << ColumnBreak();
}